

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int verify_field(flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
                flatbuffers_uoffset_t size,uint16_t align)

{
  void *pvVar1;
  flatbuffers_voffset_t fVar2;
  int c_3;
  int c_2;
  int c_1;
  int c;
  flatbuffers_uoffset_t base;
  flatbuffers_voffset_t vte;
  flatbuffers_uoffset_t k2;
  flatbuffers_uoffset_t k;
  uint16_t align_local;
  flatbuffers_uoffset_t size_local;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  pvVar1 = td->buf;
  fVar2 = read_vt_entry(td,id);
  if (fVar2 == 0) {
    if (required == 0) {
      td_local._4_4_ = 0;
    }
    else {
      td_local._4_4_ = 4;
    }
  }
  else if ((uint)td->tsize < fVar2 + size) {
    td_local._4_4_ = 0xd;
  }
  else if ((td->table + (int)pvVar1 + (uint)fVar2 & align - 1) == 0) {
    td_local._4_4_ = 0;
  }
  else {
    td_local._4_4_ = 0xc;
  }
  return td_local._4_4_;
}

Assistant:

static int verify_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, uoffset_t size, uint16_t align)
{
    uoffset_t k, k2;
    voffset_t vte;
    uoffset_t base = (uoffset_t)(size_t)td->buf;


    /*
     * Otherwise range check assumptions break, and normal access code likely also.
     * We don't require voffset_size < uoffset_size, but some checks are faster if true.
     */
    FLATCC_ASSERT(uoffset_size >= voffset_size);
    FLATCC_ASSERT(soffset_size == uoffset_size);

    vte = read_vt_entry(td, id);
    if (!vte) {
        verify(!required, flatcc_verify_error_required_field_missing);
        return flatcc_verify_ok;
    }
    trace_verify("table buffer", td->buf);
    trace_verify("table", td->table);
    trace_verify("id", id);
    trace_verify("vte", vte);

    /*
     * Note that we don't add td.table to k and we test against table
     * size not table end or buffer end. Otherwise it would not be safe
     * to optimized out the k <= k2 check for normal uoffset and voffset
     * configurations.
     */
    k = vte;
    k2 = k + size;
    verify(k2 <= td->tsize, flatcc_verify_error_table_field_out_of_range);
    /* This normally optimizes to nop. */
    verify(uoffset_size > voffset_size || k <= k2, flatcc_verify_error_table_field_size_overflow);
    trace_verify("table + vte", vte + td->table);
    k += td->table + base;
    trace_verify("entry: buf + table + vte", k);
    trace_verify("align", align);
    trace_verify("align masked entry", k & (align - 1u));
    verify(!(k & (align - 1u)), flatcc_verify_error_table_field_not_aligned);
    /* We assume the table size has already been verified. */
    return flatcc_verify_ok;
}